

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interval.cpp
# Opt level: O0

string * __thiscall Interval::dump_abi_cxx11_(string *__return_storage_ptr__,Interval *this)

{
  bool bVar1;
  ostream *poVar2;
  time_t tVar3;
  string local_230;
  string *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tag;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream out;
  ostream local_190 [376];
  Interval *local_18;
  Interval *this_local;
  
  local_18 = this;
  this_local = (Interval *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"interval");
  if (this->id != 0) {
    poVar2 = std::operator<<(local_190," @");
    std::ostream::operator<<(poVar2,this->id);
  }
  tVar3 = Datetime::toEpoch(&(this->super_Range).start);
  if (tVar3 != 0) {
    poVar2 = std::operator<<(local_190," ");
    Datetime::toISOLocalExtended_abi_cxx11_(&local_1d0,&(this->super_Range).start);
    std::operator<<(poVar2,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  tVar3 = Datetime::toEpoch(&(this->super_Range).end);
  if (tVar3 != 0) {
    poVar2 = std::operator<<(local_190," - ");
    Datetime::toISOLocalExtended_abi_cxx11_((string *)&__range2,&(this->super_Range).end);
    std::operator<<(poVar2,(string *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
  }
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->_tags);
  if (!bVar1) {
    std::operator<<(local_190," #");
    __end2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->_tags);
    tag = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->_tags);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&tag), bVar1) {
      local_210 = std::
                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end2);
      poVar2 = std::operator<<(local_190,' ');
      quoteIfNeeded(&local_230,local_210);
      std::operator<<(poVar2,(string *)&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
  }
  if ((this->synthetic & 1U) != 0) {
    std::operator<<(local_190," synthetic");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string Interval::dump () const
{
  std::stringstream out;

  out << "interval";

  if (id)
    out << " @" << id;

  if (start.toEpoch ())
    out << " " << start.toISOLocalExtended ();

  if (end.toEpoch ())
    out << " - " << end.toISOLocalExtended ();

  if (! _tags.empty ())
  {
    out << " #";
    for (auto& tag : _tags)
      out << ' ' << quoteIfNeeded (tag);
  }

  if (synthetic)
    out << " synthetic";

  return out.str ();
}